

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr.c
# Opt level: O0

void add_action(Grammar *g,State *s,uint akind,Term *aterm,Rule *arule,State *astate)

{
  uint uVar1;
  Action *pAVar2;
  Action *a;
  uint i;
  State *astate_local;
  Rule *arule_local;
  Term *aterm_local;
  uint akind_local;
  State *s_local;
  Grammar *g_local;
  
  if (akind == 2) {
    for (a._4_4_ = 0; a._4_4_ < (s->reduce_actions).n; a._4_4_ = a._4_4_ + 1) {
      if ((s->reduce_actions).v[a._4_4_]->rule == arule) {
        return;
      }
    }
    pAVar2 = new_Action(g,2,aterm,arule,astate);
    if ((s->reduce_actions).v == (Action **)0x0) {
      (s->reduce_actions).v = (s->reduce_actions).e;
      uVar1 = (s->reduce_actions).n;
      (s->reduce_actions).n = uVar1 + 1;
      (s->reduce_actions).e[uVar1] = pAVar2;
    }
    else {
      if ((s->reduce_actions).v == (s->reduce_actions).e) {
        if ((s->reduce_actions).n < 3) {
          uVar1 = (s->reduce_actions).n;
          (s->reduce_actions).n = uVar1 + 1;
          (s->reduce_actions).v[uVar1] = pAVar2;
          return;
        }
      }
      else if (((s->reduce_actions).n & 7) != 0) {
        uVar1 = (s->reduce_actions).n;
        (s->reduce_actions).n = uVar1 + 1;
        (s->reduce_actions).v[uVar1] = pAVar2;
        return;
      }
      vec_add_internal(&s->reduce_actions,pAVar2);
    }
  }
  else {
    for (a._4_4_ = 0; a._4_4_ < (s->shift_actions).n; a._4_4_ = a._4_4_ + 1) {
      if ((((s->shift_actions).v[a._4_4_]->term == aterm) &&
          ((s->shift_actions).v[a._4_4_]->state == astate)) &&
         ((s->shift_actions).v[a._4_4_]->kind == akind)) {
        return;
      }
    }
    pAVar2 = new_Action(g,akind,aterm,arule,astate);
    if ((s->shift_actions).v == (Action **)0x0) {
      (s->shift_actions).v = (s->shift_actions).e;
      uVar1 = (s->shift_actions).n;
      (s->shift_actions).n = uVar1 + 1;
      (s->shift_actions).e[uVar1] = pAVar2;
    }
    else {
      if ((s->shift_actions).v == (s->shift_actions).e) {
        if ((s->shift_actions).n < 3) {
          uVar1 = (s->shift_actions).n;
          (s->shift_actions).n = uVar1 + 1;
          (s->shift_actions).v[uVar1] = pAVar2;
          return;
        }
      }
      else if (((s->shift_actions).n & 7) != 0) {
        uVar1 = (s->shift_actions).n;
        (s->shift_actions).n = uVar1 + 1;
        (s->shift_actions).v[uVar1] = pAVar2;
        return;
      }
      vec_add_internal(&s->shift_actions,pAVar2);
    }
  }
  return;
}

Assistant:

static void add_action(Grammar *g, State *s, uint akind, Term *aterm, Rule *arule, State *astate) {
  uint i;
  Action *a;

  if (akind == ACTION_REDUCE) {
    /* eliminate duplicates */
    for (i = 0; i < s->reduce_actions.n; i++)
      if (s->reduce_actions.v[i]->rule == arule) return;
    a = new_Action(g, akind, aterm, arule, astate);
    vec_add(&s->reduce_actions, a);
  } else {
    /* eliminate duplicates */
    for (i = 0; i < s->shift_actions.n; i++)
      if (s->shift_actions.v[i]->term == aterm && s->shift_actions.v[i]->state == astate &&
          s->shift_actions.v[i]->kind == akind)
        return;
    a = new_Action(g, akind, aterm, arule, astate);
    vec_add(&s->shift_actions, a);
  }
}